

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::SharedMinimizeData::imp
          (SharedMinimizeData *this,wsum_t *lhs,LevelWeight *w,wsum_t *rhs,uint32 *lev)

{
  uint32 uVar1;
  long lVar2;
  
  uVar1 = *lev;
  while ((uVar1 != (*(uint *)w & 0x7fffffff) && (lhs[uVar1] == rhs[uVar1]))) {
    uVar1 = uVar1 + 1;
    *lev = uVar1;
  }
  while( true ) {
    if (uVar1 == (this->adjust_).ebo_.size) {
      return false;
    }
    lVar2 = lhs[uVar1];
    if (uVar1 == (*(uint *)w & 0x7fffffff)) {
      lVar2 = lVar2 + w->weight;
      w = w + (*(uint *)w >> 0x1f);
    }
    if (lVar2 != rhs[uVar1]) break;
    uVar1 = uVar1 + 1;
  }
  return rhs[uVar1] < lVar2;
}

Assistant:

bool SharedMinimizeData::imp(wsum_t* lhs, const LevelWeight* w, const wsum_t* rhs, uint32& lev) const {
	assert(lev <= w->level && std::equal(lhs, lhs+lev, rhs));
	while (lev != w->level && lhs[lev] == rhs[lev]) { ++lev; }
	for (uint32 i = lev, end = numRules(); i != end; ++i) {
		wsum_t temp = lhs[i];
		if (i == w->level) { temp += w->weight; if (w->next) ++w; }
		if (temp != rhs[i]){ return temp > rhs[i]; }
	}
	return false;
}